

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool google::protobuf::compiler::js::anon_unknown_0::ReturnsNullWhenUnset
               (GeneratorOptions *options,FieldDescriptor *field)

{
  once_flag *__once;
  bool bVar1;
  GeneratorOptions *local_18;
  _func_void_FieldDescriptor_ptr *local_10;
  
  __once = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
  if (__once != (once_flag *)0x0) {
    local_10 = FieldDescriptor::TypeOnceInit;
    local_18 = options;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,&local_10,(FieldDescriptor **)&local_18);
  }
  if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap +
               (ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8) * 4) != 10) ||
     (bVar1 = true, *(int *)((long)&(options->namespace_prefix).field_2 + 0xc) != 1)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ReturnsNullWhenUnset(const GeneratorOptions& options,
                          const FieldDescriptor* field) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      field->is_optional()) {
    return true;
  }

  // TODO(haberman): remove this case and unconditionally return false.
  return UseBrokenPresenceSemantics(options, field) && !field->is_repeated() &&
         !field->has_default_value();
}